

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::TraverseSchema::checkElemDeclValueConstraint
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,XMLCh *valConstraint,
          ComplexTypeInfo *typeInfo,DatatypeValidator *validator)

{
  short sVar1;
  XMLStringPool *pXVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  XMLCh *pXVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ArrayJanitor<char16_t> tempCanonical;
  
  if (validator == (DatatypeValidator *)0x0) {
    bVar3 = false;
    goto LAB_0031bdae;
  }
  if (validator->fType == ID) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x5c,
                      ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,valConstraint,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
  sVar1 = validator->fWhiteSpace;
  if (sVar1 == 1) {
    bVar3 = XMLString::isWSReplaced(valConstraint);
LAB_0031bc18:
    if (bVar3 == false) {
      pXVar7 = XMLString::replicate(valConstraint,this->fMemoryManager);
      ArrayJanitor<char16_t>::ArrayJanitor(&tempCanonical,pXVar7,this->fMemoryManager);
      if (sVar1 == 1) {
        XMLString::replaceWS(pXVar7,this->fMemoryManager);
      }
      else {
        XMLString::collapseWS(pXVar7,this->fMemoryManager);
      }
      pXVar2 = this->fStringPool;
      uVar5 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,pXVar7);
      iVar6 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])(pXVar2,(ulong)uVar5);
      valConstraint = (XMLCh *)CONCAT44(extraout_var,iVar6);
      ArrayJanitor<char16_t>::~ArrayJanitor(&tempCanonical);
    }
  }
  else if (sVar1 == 2) {
    bVar3 = XMLString::isWSCollapsed(valConstraint);
    goto LAB_0031bc18;
  }
  (*(validator->super_XSerializable)._vptr_XSerializable[8])
            (validator,valConstraint,0,this->fMemoryManager);
  iVar6 = (*(validator->super_XSerializable)._vptr_XSerializable[7])
                    (validator,valConstraint,this->fMemoryManager,0);
  pXVar7 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
  ArrayJanitor<char16_t>::ArrayJanitor(&tempCanonical,pXVar7,this->fMemoryManager);
  bVar3 = XMLString::equals(pXVar7,valConstraint);
  if (!bVar3) {
    (*(validator->super_XSerializable)._vptr_XSerializable[8])
              (validator,pXVar7,0,this->fMemoryManager);
    pXVar2 = this->fStringPool;
    uVar5 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,pXVar7);
    iVar6 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])(pXVar2,(ulong)uVar5);
    valConstraint = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
  }
  SchemaElementDecl::setDefaultValue(elemDecl,valConstraint);
  ArrayJanitor<char16_t>::~ArrayJanitor(&tempCanonical);
  bVar3 = true;
LAB_0031bdae:
  if (typeInfo != (ComplexTypeInfo *)0x0) {
    uVar5 = typeInfo->fContentType;
    if ((5 < uVar5) || ((0x2cU >> (uVar5 & 0x1f) & 1) == 0)) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x37,
                        ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    if ((uVar5 & 0xfffffffe) == 2) {
      bVar4 = emptiableParticle(this,typeInfo->fContentSpec);
      if (!bVar4) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x5e,
                          ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
  }
  return bVar3;
}

Assistant:

bool
TraverseSchema::checkElemDeclValueConstraint(const DOMElement* const elem,
                                             SchemaElementDecl* const elemDecl,
                                             const XMLCh* const valConstraint,
                                             ComplexTypeInfo* const typeInfo,
                                             DatatypeValidator* const validator)
{
    bool isValid = false;
    if (validator)
    {
        if (validator->getType() == DatatypeValidator::ID)
            reportSchemaError(
                elem, XMLUni::fgXMLErrDomain, XMLErrs::ElemIDValueConstraint
                , elemDecl->getBaseName(), valConstraint
            );

        try
        {
            const XMLCh* valueToCheck = valConstraint;
            short wsFacet = validator->getWSFacet();
            if((wsFacet == DatatypeValidator::REPLACE && !XMLString::isWSReplaced(valueToCheck)) ||
               (wsFacet == DatatypeValidator::COLLAPSE && !XMLString::isWSCollapsed(valueToCheck)))
            {
                XMLCh* normalizedValue=XMLString::replicate(valueToCheck, fMemoryManager);
                ArrayJanitor<XMLCh> tempURIName(normalizedValue, fMemoryManager);
                if(wsFacet == DatatypeValidator::REPLACE)
                    XMLString::replaceWS(normalizedValue, fMemoryManager);
                else if(wsFacet == DatatypeValidator::COLLAPSE)
                    XMLString::collapseWS(normalizedValue, fMemoryManager);
                valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
            }

            validator->validate(valueToCheck,0,fMemoryManager);

            XMLCh* canonical = (XMLCh*) validator->getCanonicalRepresentation(valueToCheck, fMemoryManager);
            ArrayJanitor<XMLCh> tempCanonical(canonical, fMemoryManager);

            if(!XMLString::equals(canonical, valueToCheck))
            {
                validator->validate(canonical, 0, fMemoryManager);
                valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(canonical));
            }

            elemDecl->setDefaultValue(valueToCheck);

            isValid = true;
        }
        catch(const XMLException& excep)
        {
            reportSchemaError(elem, excep);
        }
        catch(const OutOfMemoryException&)
        {
            throw;
        }
        catch(...)
        {
            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::DatatypeValidationFailure, valConstraint);
        }
    }

    if (typeInfo)
    {
        int contentSpecType = typeInfo->getContentType();

        if (contentSpecType != SchemaElementDecl::Simple &&
            contentSpecType != SchemaElementDecl::Mixed_Simple &&
            contentSpecType != SchemaElementDecl::Mixed_Complex)
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NotSimpleOrMixedElement, elemDecl->getBaseName());

        if (((contentSpecType == SchemaElementDecl::Mixed_Complex
             || contentSpecType == SchemaElementDecl::Mixed_Simple)
            && !emptiableParticle(typeInfo->getContentSpec())))
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::EmptiableMixedContent, elemDecl->getBaseName());
    }

    return isValid;
}